

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

void __thiscall
duckdb::HashJoinLocalSourceState::ExternalProbe
          (HashJoinLocalSourceState *this,HashJoinGlobalSinkState *sink,
          HashJoinGlobalSourceState *gstate,DataChunk *chunk)

{
  ScanStructure *this_00;
  DataChunk *chunk_00;
  DataChunk *this_01;
  DataChunk *this_02;
  JoinType join_type;
  byte bVar1;
  bool bVar2;
  uint uVar3;
  pointer pPVar4;
  pointer pCVar5;
  pointer pJVar6;
  pointer this_03;
  idx_t *piVar7;
  optional_ptr<duckdb::Vector,_true> precomputed_hashes;
  unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true> *this_04;
  unique_lock<std::mutex> guard;
  unique_lock<std::mutex> local_40;
  
  this_00 = &this->scan_structure;
  bVar1 = (this->scan_structure).is_null;
  if ((bool)bVar1 == false) {
    JoinHashTable::ScanStructure::Next(this_00,&this->lhs_join_keys,&this->lhs_output,chunk);
    if (chunk->count != 0) {
      return;
    }
    bVar2 = JoinHashTable::ScanStructure::PointersExhausted(this_00);
    if (!bVar2) {
      return;
    }
    bVar1 = (this->scan_structure).is_null;
  }
  if (((bVar1 & 1) == 0) || (this->empty_ht_probe_in_progress == true)) {
    (this->scan_structure).is_null = true;
    this->empty_ht_probe_in_progress = false;
    pPVar4 = unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>,_true>
             ::operator->(&sink->probe_spill);
    pCVar5 = unique_ptr<duckdb::ColumnDataConsumer,_std::default_delete<duckdb::ColumnDataConsumer>,_true>
             ::operator->(&pPVar4->consumer);
    ColumnDataConsumer::FinishChunk(pCVar5,&this->probe_local_scan);
    local_40._M_device = &(gstate->super_GlobalSourceState).super_StateWithBlockableTasks.lock;
    local_40._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    gstate->probe_chunk_done = gstate->probe_chunk_done + 1;
    ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  }
  else {
    pPVar4 = unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>,_true>
             ::operator->(&sink->probe_spill);
    pCVar5 = unique_ptr<duckdb::ColumnDataConsumer,_std::default_delete<duckdb::ColumnDataConsumer>,_true>
             ::operator->(&pPVar4->consumer);
    chunk_00 = &this->lhs_probe_chunk;
    ColumnDataConsumer::ScanChunk(pCVar5,&this->probe_local_scan,chunk_00);
    this_01 = &this->lhs_join_keys;
    DataChunk::Reset(this_01);
    ExpressionExecutor::Execute(&this->lhs_join_key_executor,chunk_00,this_01);
    this_02 = &this->lhs_output;
    DataChunk::ReferenceColumns(this_02,chunk_00,&(sink->op->lhs_output_columns).col_idxs);
    this_04 = &sink->hash_table;
    pJVar6 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
             operator->(this_04);
    this_03 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(&pJVar6->data_collection);
    piVar7 = TupleDataCollection::Count(this_03);
    if ((*piVar7 != 0) ||
       ((uVar3 = (uint)(byte)(gstate->op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                             super_CachingPhysicalOperator.field_0x81, uVar3 < 0xb &&
        ((0x62cU >> (uVar3 & 0x1f) & 1) != 0)))) {
      precomputed_hashes.ptr = vector<duckdb::Vector,_true>::back(&chunk_00->data);
      pJVar6 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
               operator->(this_04);
      JoinHashTable::Probe
                (pJVar6,this_00,this_01,&this->join_key_state,&this->probe_state,precomputed_hashes)
      ;
      JoinHashTable::ScanStructure::Next(this_00,this_01,this_02,chunk);
      return;
    }
    pJVar6 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
             operator->(this_04);
    join_type = pJVar6->join_type;
    pJVar6 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
             operator->(this_04);
    PhysicalComparisonJoin::ConstructEmptyJoinResult(join_type,pJVar6->has_null,this_02,chunk);
    this->empty_ht_probe_in_progress = true;
  }
  return;
}

Assistant:

void HashJoinLocalSourceState::ExternalProbe(HashJoinGlobalSinkState &sink, HashJoinGlobalSourceState &gstate,
                                             DataChunk &chunk) {
	D_ASSERT(local_stage == HashJoinSourceStage::PROBE && sink.hash_table->finalized);

	if (!scan_structure.is_null) {
		// Still have elements remaining (i.e. we got >STANDARD_VECTOR_SIZE elements in the previous probe)
		scan_structure.Next(lhs_join_keys, lhs_output, chunk);
		if (chunk.size() != 0 || !scan_structure.PointersExhausted()) {
			return;
		}
	}

	if (!scan_structure.is_null || empty_ht_probe_in_progress) {
		// Previous probe is done
		scan_structure.is_null = true;
		empty_ht_probe_in_progress = false;
		sink.probe_spill->consumer->FinishChunk(probe_local_scan);
		auto guard = gstate.Lock();
		gstate.probe_chunk_done++;
		return;
	}

	// Scan input chunk for next probe
	sink.probe_spill->consumer->ScanChunk(probe_local_scan, lhs_probe_chunk);

	// Get the probe chunk columns/hashes
	lhs_join_keys.Reset();
	lhs_join_key_executor.Execute(lhs_probe_chunk, lhs_join_keys);
	lhs_output.ReferenceColumns(lhs_probe_chunk, sink.op.lhs_output_columns.col_idxs);

	if (sink.hash_table->Count() == 0 && !gstate.op.EmptyResultIfRHSIsEmpty()) {
		gstate.op.ConstructEmptyJoinResult(sink.hash_table->join_type, sink.hash_table->has_null, lhs_output, chunk);
		empty_ht_probe_in_progress = true;
		return;
	}

	// Perform the probe
	auto precomputed_hashes = &lhs_probe_chunk.data.back();
	sink.hash_table->Probe(scan_structure, lhs_join_keys, join_key_state, probe_state, precomputed_hashes);
	scan_structure.Next(lhs_join_keys, lhs_output, chunk);
}